

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O0

void hwnet::http::HttpSession::onClose(Ptr *ss)

{
  element_type *this;
  any *operand;
  HttpSession *pHVar1;
  HttpSession *session;
  Ptr *ss_local;
  
  this = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)ss);
  operand = TCPSocket::GetUserData(this);
  pHVar1 = any_cast<hwnet::http::HttpSession*>(operand);
  std::
  function<void_(std::shared_ptr<hwnet::http::HttpRequest>_&,_std::shared_ptr<hwnet::http::HttpResponse>_&)>
  ::operator=(&pHVar1->onRequest,(nullptr_t)0x0);
  return;
}

Assistant:

void HttpSession::onClose(const TCPSocket::Ptr &ss) {
	auto session = any_cast<HttpSession*>(ss->GetUserData());
	session->onRequest = nullptr;
}